

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,mz_uint64 cur_file_ofs,mz_uint32 n)

{
  size_t sVar1;
  size_t local_1058;
  size_t local_1050;
  undefined1 local_1038 [4];
  mz_uint32 s;
  char buf [4096];
  uint local_2c;
  mz_uint64 mStack_28;
  mz_uint32 n_local;
  mz_uint64 cur_file_ofs_local;
  mz_zip_archive *pZip_local;
  
  if (n < 0x1001) {
    local_1050 = (size_t)n;
  }
  else {
    local_1050 = 0x1000;
  }
  memset(local_1038,0,local_1050);
  local_2c = n;
  mStack_28 = cur_file_ofs;
  while( true ) {
    if (local_2c == 0) {
      return 1;
    }
    if (local_2c < 0x1001) {
      local_1058 = (size_t)local_2c;
    }
    else {
      local_1058 = 0x1000;
    }
    sVar1 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mStack_28,local_1038,local_1058);
    if (sVar1 != local_1058) break;
    mStack_28 = local_1058 + mStack_28;
    local_2c = local_2c - (int)local_1058;
  }
  if (pZip != (mz_zip_archive *)0x0) {
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip, mz_uint64 cur_file_ofs, mz_uint32 n)
{
    char buf[4096];
    memset(buf, 0, MZ_MIN(sizeof(buf), n));
    while (n)
    {
        mz_uint32 s = MZ_MIN(sizeof(buf), n);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_file_ofs, buf, s) != s)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_file_ofs += s;
        n -= s;
    }
    return MZ_TRUE;
}